

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::endEditBlock(QTextDocumentPrivate *this)

{
  int iVar1;
  const_reference pQVar2;
  reference pQVar3;
  byte bVar4;
  long in_RDI;
  bool bVar5;
  bool wasBlocking;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  iVar1 = *(int *)(in_RDI + 0xcc) + -1;
  *(int *)(in_RDI + 0xcc) = iVar1;
  if (iVar1 == 0) {
    if (((*(byte *)(in_RDI + 0xb8) & 1) != 0) && (0 < *(int *)(in_RDI + 0xbc))) {
      pQVar2 = QList<QTextUndoCommand>::at
                         ((QList<QTextUndoCommand> *)
                          CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),in_RDI);
      bVar5 = ((byte)pQVar2->field_0x2 >> 1 & 1) != 0;
      bVar4 = (bVar5 ^ 0xffU) & 1;
      pQVar2 = QList<QTextUndoCommand>::at
                         ((QList<QTextUndoCommand> *)
                          ((CONCAT17(bVar5,in_stack_fffffffffffffff0) ^ 0xff00000000000000) &
                          0x1ffffffffffffff),in_RDI);
      if ((pQVar2->field_0x2 & 1) != 0) {
        pQVar3 = QList<QTextUndoCommand>::operator[]
                           ((QList<QTextUndoCommand> *)CONCAT17(bVar4,in_stack_fffffffffffffff0),
                            in_RDI);
        pQVar3->field_0x2 = pQVar3->field_0x2 & 0xfd | 2;
        if ((bVar4 & 1) != 0) {
          document((QTextDocumentPrivate *)0x7d2a25);
          QTextDocument::undoCommandAdded((QTextDocument *)0x7d2a2d);
        }
      }
    }
    *(undefined4 *)(in_RDI + 0xd0) = 0xffffffff;
    finishEdit(this);
  }
  return;
}

Assistant:

void QTextDocumentPrivate::endEditBlock()
{
    Q_ASSERT(editBlock > 0);
    if (--editBlock)
        return;

    if (undoEnabled && undoState > 0) {
        const bool wasBlocking = !undoStack.at(undoState - 1).block_end;
        if (undoStack.at(undoState - 1).block_part) {
            undoStack[undoState - 1].block_end = true;
            if (wasBlocking)
                emit document()->undoCommandAdded();
        }
    }

    editBlockCursorPosition = -1;

    finishEdit();
}